

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsObjectHasOwnProperty(JsValueRef object,JsValueRef propertyId,bool *hasOwnProperty)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  JavascriptLibrary *propertyRecord;
  bool bVar3;
  JsErrorCode exitStatus;
  BOOL BVar4;
  JsrtContext *currentContext;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  PropertyString *propString;
  void *unaff_retaddr;
  undefined1 auStack_c8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 auStack_88 [8];
  TTDRecorder _actionEntryPopper;
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_3c;
  PropertyString *pPStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  auStack_88 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  exitStatus = CheckContext(currentContext,true,false);
  if (exitStatus != JsNoError) goto LAB_00364d81;
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  pPStack_38 = (PropertyString *)propertyId;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_3c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&_actionEntryPopper.m_resultPtr,scriptContext,
             (ScriptEntryExitRecord *)auStack_c8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&_actionEntryPopper.m_resultPtr);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x5eb,"(false)","Need to implement support here!!!");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  exitStatus = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      exitStatus = JsErrorArgumentNotObject;
    }
    else {
      pRVar6 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00364d6f;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
      }
      exitStatus = JsErrorInvalidArgument;
      if ((ulong)pPStack_38 >> 0x30 == 0 && pPStack_38 != (PropertyString *)0x0) {
        pRVar6 = Js::VarTo<Js::RecyclableObject>(pPStack_38);
        pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          exitStatus = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00364d6f;
          pPStack_38 = (PropertyString *)Js::CrossSite::MarshalVar(scriptContext,pRVar6,false);
        }
        if (hasOwnProperty == (bool *)0x0) {
          exitStatus = JsErrorNullArgument;
        }
        else {
          *hasOwnProperty = false;
          __enterScriptObject.library = (JavascriptLibrary *)0x0;
          pRVar6 = Js::VarTo<Js::RecyclableObject>(pPStack_38);
          exitStatus = InternalGetPropertyRecord
                                 (scriptContext,pRVar6,
                                  (PropertyRecord **)&__enterScriptObject.library);
          propertyRecord = __enterScriptObject.library;
          if (exitStatus == JsNoError) {
            bVar3 = Js::VarIs<Js::PropertyString>(pPStack_38);
            exitStatus = JsNoError;
            propString = pPStack_38;
            if (!bVar3) {
              propString = (PropertyString *)0x0;
            }
            JsHasOwnPropertyCommon
                      (scriptContext,object,(PropertyRecord *)propertyRecord,hasOwnProperty,
                       propString);
          }
        }
      }
    }
  }
LAB_00364d6f:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)&_actionEntryPopper.m_resultPtr);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
LAB_00364d81:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_88,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsObjectHasOwnProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId, _Out_ bool *hasOwnProperty)
{
    return ContextAPIWrapper<true>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(hasOwnProperty);
        *hasOwnProperty = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        return JsHasOwnPropertyCommon(scriptContext, object, propertyRecord, hasOwnProperty, Js::VarIs<Js::PropertyString>(propertyId) ? (Js::PropertyString*)propertyId : nullptr);
    });
}